

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,unsigned_long,char>
          (ResultBuilder *this,unsigned_long *lhs,char *rhs)

{
  char cVar1;
  unsigned_long uVar2;
  ContextOptions *pCVar3;
  char *in_R8;
  String SStack_38;
  
  cVar1 = *rhs;
  uVar2 = *lhs;
  (this->super_AssertData).m_failed = uVar2 != (long)cVar1;
  if ((uVar2 == (long)cVar1) && (pCVar3 = getContextOptions(), pCVar3->success != true)) {
    return;
  }
  stringifyBinaryExpr<unsigned_long,char>
            (&SStack_38,(detail *)lhs,(unsigned_long *)0x1a184a,rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }